

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O2

int make_args(char *s,int *aargc,char ***aargv)

{
  size_t sVar1;
  char **ppcVar2;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  
  sVar1 = strlen(s);
  ppcVar2 = (char **)malloc(sVar1 * 4 & 0xfffffffffffffff8);
  ppcVar4 = ppcVar2;
  if (ppcVar2 != (char **)0x0) {
    uVar5 = 0;
    while( true ) {
      pcVar3 = (char *)0x0;
      if (uVar5 == 0) {
        pcVar3 = s;
      }
      pcVar3 = strtok(pcVar3," \t");
      if (pcVar3 == (char *)0x0) break;
      ppcVar2[uVar5] = pcVar3;
      uVar5 = uVar5 + 1;
    }
    ppcVar4 = (char **)(uVar5 & 0xffffffff);
    ppcVar2[(long)ppcVar4] = (char *)0x0;
    *aargv = ppcVar2;
    *aargc = (int)uVar5;
  }
  return (int)ppcVar4;
}

Assistant:

static int make_args(char *s,         // string containing words (gets trashed!)
                     int *aargc,      // pointer to argc
                     char ***aargv) { // pointer to argv
  char *ss, **argv;
  if ((argv=(char**)malloc(sizeof(char*) * (strlen(s)/2)))==NULL) {
    return -1;
  }
  int t;
  for(t=0; (t==0)?(ss=strtok(s," \t")):(ss=strtok(0," \t")); t++) {
    argv[t] = ss;
  }
  argv[t] = 0;
  aargv[0] = argv;
  aargc[0] = t;
  return(t);
}